

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O3

MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
* wasm::WATParser::anon_unknown_21::assertion
            (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
             *__return_storage_ptr__,Lexer *in)

{
  _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *this;
  _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
  *this_00;
  undefined8 *puVar1;
  undefined1 *puVar2;
  vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
  *this_01;
  undefined1 *puVar3;
  _Storage<double,_true> _Var4;
  size_t pos;
  bool bVar5;
  optional<float> oVar6;
  MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
  *extraout_RAX;
  MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
  *extraout_RAX_00;
  MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
  *extraout_RAX_01;
  MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
  *extraout_RAX_02;
  MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
  *extraout_RAX_03;
  MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
  *pMVar7;
  bool bVar8;
  int iVar9;
  Literal *other;
  _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
  *__args;
  undefined8 uVar10;
  _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction> *__rhs;
  _Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
  *__x;
  _Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *p_Var11;
  _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  *p_Var12;
  _Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
  *__rhs_00;
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *pRVar13;
  MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *__rhs_01;
  _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
  *__rhs_02;
  _Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
  *__rhs_03;
  _Alloc_hider _Var14;
  _Storage<double,_true> _Var15;
  undefined1 auVar16 [8];
  undefined4 uVar17;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string_view expected_13;
  string_view expected_14;
  string_view expected_15;
  string_view expected_16;
  string_view expected_17;
  optional<double> oVar18;
  string local_4f0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4d0;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  undefined1 local_448 [32];
  __index_type local_428;
  undefined1 auStack_418 [8];
  ExpectedResults res;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  undefined1 auStack_2e8 [8];
  LaneResults lanes;
  undefined1 local_2c8 [8];
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> a_2;
  undefined1 local_248;
  __index_type local_240;
  undefined1 local_238 [8];
  Result<wasm::Literal> c;
  undefined1 local_208;
  undefined1 local_1c8 [8];
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> a;
  pointer local_148;
  ulong uStack_140;
  undefined1 local_138 [8];
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> _val;
  undefined1 local_b8;
  __index_type local_b0;
  _Storage<double,_true> local_a8;
  Result<wasm::WATParser::NaNKind> _val_1;
  Result<wasm::WATParser::NaNKind> kind;
  size_type __dnew_2;
  pointer local_48;
  ulong uStack_40;
  char local_38;
  
  expected._M_str = "assert_return";
  expected._M_len = 0xd;
  bVar5 = Lexer::takeSExprStart(in,expected);
  if (bVar5) {
    action((Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
           local_1c8,in);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_138,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_1c8);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x01') {
      puVar2 = (undefined1 *)
               ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      local_238 = (undefined1  [8])puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_138,
                 (undefined1 *)
                 (_val.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_ + (long)local_138));
      local_2c8 = (undefined1  [8])
                  ((long)&a_2.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  + 8);
      if (local_238 == (undefined1  [8])puVar2) {
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
      }
      else {
        local_2c8 = local_238;
      }
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
      local_248 = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_138);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_138);
      auStack_418 = (undefined1  [8])0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&in->annotations;
      local_4d0 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&in->file;
      this = (_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
             ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20);
      while (bVar5 = Lexer::peekRParen(in), !bVar5) {
        local_138 = (undefined1  [8])in->pos;
        std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
        vector((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
               &_val,(vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      *)res.
                        super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x38] = '\0';
        bVar5 = (in->file).
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == true;
        if (bVar5) {
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._24_8_ = (long)&_val.val.
                                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         + 0x28;
          _Var14._M_p = (in->file).
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&_val.val.
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     + 0x18),_Var14._M_p,
                     _Var14._M_p +
                     (in->file).
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_string_length);
        }
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._64_8_ = (in->buffer)._M_len;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._72_8_ = (in->buffer)._M_str;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x38] = bVar5;
        const_((Result<wasm::Literal> *)local_238,(Lexer *)local_138);
        if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ != '\x01') {
          in->pos = (size_t)local_138;
          std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
          operator=((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     *)res.
                       super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     *)&_val);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_copy_assign(local_4d0,
                           (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&_val.val.
                                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              + 0x18));
          (in->buffer)._M_len =
               _val.val.
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               ._M_u._64_8_;
          (in->buffer)._M_str =
               (char *)_val.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       ._M_u._72_8_;
          other = (Literal *)0x0;
          if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
            other = (Literal *)local_238;
          }
          Literal::Literal((Literal *)
                           ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                   .super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                           0x20),other);
          uStack_40 = uStack_40 & 0xffffffffffffff00;
          local_38 = '\0';
          goto LAB_00c1d8a4;
        }
        expected_00._M_str = "f32.const";
        expected_00._M_len = 9;
        bVar5 = Lexer::takeSExprStart(in,expected_00);
        if (bVar5) {
          nan((anon_unknown_21 *)this,(char *)in);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)&local_a8,
                          (_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)this);
          if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ ==
              '\x01') {
            a.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._104_8_ = &local_148;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       ((long)&a.val.
                               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       + 0x68),local_a8._M_value,
                       (undefined1 *)
                       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_
                       + (long)local_a8));
LAB_00c1d12c:
            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48;
            if ((pointer *)
                a.val.
                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                ._104_8_ == &local_148) {
              uStack_40 = uStack_140;
            }
            else {
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                   a.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._M_index;
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                   a.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._105_7_;
            }
            local_48 = local_148;
            local_38 = '\x01';
            std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                              &local_a8);
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                              &local_a8);
            bVar5 = Lexer::takeRParen(in);
            uVar10 = _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
            if (bVar5) {
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                   _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index;
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_3_ =
                   _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_3_;
              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = uVar10;
LAB_00c1d315:
              uStack_40 = CONCAT71(uStack_40._1_7_,2);
              local_38 = '\0';
            }
            else {
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              a.val.
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              ._M_index = '\x19';
              a.val.
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              ._105_7_ = 0;
              local_3e8._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create
                                      ((ulong *)&local_3e8,
                                       (ulong)((long)&a.val.
                                                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                              + 0x68));
              local_3e8.field_2._M_allocated_capacity =
                   a.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._104_8_;
              builtin_strncpy(local_3e8._M_dataplus._M_p,"expected end of f32.const",0x19);
              local_3e8._M_string_length =
                   a.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._104_8_;
              local_3e8._M_dataplus._M_p
              [a.val.
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               ._104_8_] = '\0';
              Lexer::err((Err *)&local_a8,in,&local_3e8);
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48;
              _Var15 = (_Storage<double,_true>)
                       ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
              if (local_a8 == _Var15) {
                uStack_40 = CONCAT71(_val_1.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                     ._M_u._17_7_,
                                     _val_1.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                     ._M_u._16_1_);
              }
              else {
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = local_a8;
              }
              local_48 = (pointer)_val_1.val.
                                  super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _M_u._8_8_;
              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                   _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                   0xffffffffffffff00;
              local_38 = '\x01';
              uVar10 = local_3e8.field_2._M_allocated_capacity;
              _Var14._M_p = local_3e8._M_dataplus._M_p;
              local_a8 = _Var15;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
LAB_00c1d894:
                local_a8 = (_Storage<double,_true>)
                           ((long)&_val_1.val.
                                   super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
                local_38 = '\x01';
                _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                operator_delete(_Var14._M_p,uVar10 + 1);
              }
            }
          }
LAB_00c1d89c:
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
          ~_Variant_storage(this);
        }
        else {
          expected_01._M_str = "f64.const";
          expected_01._M_len = 9;
          bVar5 = Lexer::takeSExprStart(in,expected_01);
          if (bVar5) {
            nan((anon_unknown_21 *)this,(char *)in);
            std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::
            _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)&local_a8
                            ,(_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)this);
            if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ ==
                '\x01') {
              a.val.
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              ._104_8_ = &local_148;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)
                         ((long)&a.val.
                                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         + 0x68),local_a8._M_value,
                         (undefined1 *)
                         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _0_8_ + (long)local_a8));
              goto LAB_00c1d12c;
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                              &local_a8);
            bVar5 = Lexer::takeRParen(in);
            uVar10 = _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
            if (bVar5) {
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                   _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index;
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_3_ =
                   _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_3_;
              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = uVar10;
              goto LAB_00c1d315;
            }
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            a.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_index = '\x19';
            a.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._105_7_ = 0;
            local_3c8._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&local_3c8,
                                     (ulong)((long)&a.val.
                                                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                            + 0x68));
            local_3c8.field_2._M_allocated_capacity =
                 a.val.
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 ._104_8_;
            builtin_strncpy(local_3c8._M_dataplus._M_p,"expected end of f64.const",0x19);
            local_3c8._M_string_length =
                 a.val.
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 ._104_8_;
            local_3c8._M_dataplus._M_p
            [a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._104_8_] = '\0';
            Lexer::err((Err *)&local_a8,in,&local_3c8);
            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48;
            _Var15 = (_Storage<double,_true>)
                     ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
            if (local_a8 == _Var15) {
              uStack_40 = CONCAT71(_val_1.val.
                                   super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                   ._M_u._17_7_,
                                   _val_1.val.
                                   super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                   ._M_u._16_1_);
            }
            else {
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = local_a8;
            }
            local_48 = (pointer)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                _M_u._8_8_;
            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                 _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                 0xffffffffffffff00;
            local_38 = '\x01';
            uVar10 = local_3c8.field_2._M_allocated_capacity;
            _Var14._M_p = local_3c8._M_dataplus._M_p;
            local_a8 = _Var15;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) goto LAB_00c1d894;
            goto LAB_00c1d89c;
          }
          expected_02._M_str = "v128.const";
          expected_02._M_len = 10;
          bVar5 = Lexer::takeSExprStart(in,expected_02);
          if (bVar5) {
            auStack_2e8 = (undefined1  [8])0x0;
            lanes.
            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            lanes.
            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            expected_03._M_str = "f32x4";
            expected_03._M_len = 5;
            bVar5 = Lexer::takeKeyword(in,expected_03);
            if (bVar5) {
              iVar9 = 4;
              do {
                oVar6 = Lexer::takeF32(in);
                if (((ulong)oVar6.super__Optional_base<float,_true,_true>._M_payload.
                            super__Optional_payload_base<float> >> 0x20 & 1) == 0) {
                  nan((anon_unknown_21 *)this,(char *)in);
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::_Copy_ctor_base
                            ((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                             &local_a8,
                             (_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)this);
                  if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_
                      != '\x01') {
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               &local_a8);
                    local_a8._0_4_ =
                         _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_4_;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 4
                    ;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._16_1_ =
                         1;
                    std::
                    vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                    ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                              ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                                *)auStack_2e8,
                               (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)&local_a8);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                       *)&local_a8);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                              (this);
                    goto LAB_00c1d25c;
                  }
                  a.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._104_8_ = &local_148;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)
                             ((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68),local_a8._M_value,
                             (undefined1 *)
                             (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u
                              ._0_8_ + (long)local_a8));
LAB_00c1db51:
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                       &local_48;
                  if ((pointer *)
                      a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._104_8_ == &local_148) {
                    uStack_40 = uStack_140;
                  }
                  else {
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                         a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_index;
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                         a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._105_7_;
                  }
                  local_48 = local_148;
                  local_38 = '\x01';
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                            ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                             &local_a8);
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                            (this);
                  goto LAB_00c1dba2;
                }
                local_a8._0_4_ =
                     oVar6.super__Optional_base<float,_true,_true>._M_payload.
                     super__Optional_payload_base<float>._M_payload;
                _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ = 4;
                Literal::Literal((Literal *)this,(Literal *)&local_a8);
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._16_1_ = 0;
                std::
                vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                          ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                            *)auStack_2e8,(variant<wasm::Literal,_wasm::WATParser::NaNResult> *)this
                          );
                std::__detail::__variant::
                _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                   *)this);
                Literal::~Literal((Literal *)&local_a8);
LAB_00c1d25c:
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
LAB_00c1d4ad:
              bVar5 = Lexer::takeRParen(in);
              if (bVar5) {
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                     auStack_2e8;
                local_48 = lanes.
                           super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                auStack_2e8 = (undefined1  [8])0x0;
                lanes.
                super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                lanes.
                super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                uStack_40 = CONCAT71(uStack_40._1_7_,3);
                local_38 = '\0';
              }
              else {
                local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
                local_a8._M_value = 1.28457067918724e-322;
                local_388._M_dataplus._M_p =
                     (pointer)std::__cxx11::string::_M_create((ulong *)&local_388,(ulong)&local_a8);
                local_388.field_2._M_allocated_capacity = (size_type)local_a8;
                builtin_strncpy(local_388._M_dataplus._M_p,"expected end of v128.const",0x1a);
                local_388._M_string_length = (size_type)local_a8;
                local_388._M_dataplus._M_p[(long)local_a8] = '\0';
                Lexer::err((Err *)this,in,&local_388);
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48
                ;
                puVar2 = (undefined1 *)
                         ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
                if ((undefined1 *)
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ ==
                    puVar2) {
                  uStack_40 = CONCAT71(kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._17_7_,
                                       kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._16_1_);
                }
                else {
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index;
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_;
                }
                local_48 = (pointer)kind.val.
                                    super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                    ._M_u._8_8_;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                     kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                     0xffffffffffffff00;
                local_38 = '\x01';
                uVar10 = local_388.field_2._M_allocated_capacity;
                _Var14._M_p = local_388._M_dataplus._M_p;
                _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = puVar2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_dataplus._M_p != &local_388.field_2) {
LAB_00c1db1c:
                  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                       (long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8;
                  local_38 = '\x01';
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                  operator_delete(_Var14._M_p,(ulong)(uVar10 + 1));
                }
              }
            }
            else {
              expected_05._M_str = "f64x2";
              expected_05._M_len = 5;
              bVar5 = Lexer::takeKeyword(in,expected_05);
              if (bVar5) {
                bVar5 = true;
                do {
                  bVar8 = bVar5;
                  oVar18 = Lexer::takeF64(in);
                  if (((undefined1  [16])
                       oVar18.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double> & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) {
                    nan((anon_unknown_21 *)this,(char *)in);
                    std::__detail::__variant::
                    _Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::_Copy_ctor_base
                              ((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               &local_a8,
                               (_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)this);
                    if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                        _24_1_ == '\x01') {
                      a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._104_8_ = &local_148;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)
                                 ((long)&a.val.
                                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 + 0x68),local_a8._M_value,
                                 (undefined1 *)
                                 (_val_1.val.
                                  super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _M_u._0_8_ + (long)local_a8));
                      goto LAB_00c1db51;
                    }
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               &local_a8);
                    local_a8._0_4_ =
                         _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_4_;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 5
                    ;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._16_1_ =
                         1;
                    std::
                    vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                    ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                              ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                                *)auStack_2e8,
                               (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)&local_a8);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                       *)&local_a8);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                              (this);
                  }
                  else {
                    local_a8 = oVar18.super__Optional_base<double,_true,_true>._M_payload.
                               super__Optional_payload_base<double>._M_payload;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ = 5
                    ;
                    Literal::Literal((Literal *)this,(Literal *)&local_a8);
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._16_1_ =
                         0;
                    std::
                    vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                    ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                              ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                                *)auStack_2e8,
                               (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)this);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                       *)this);
                    Literal::~Literal((Literal *)&local_a8);
                  }
                  bVar5 = false;
                } while (bVar8);
                goto LAB_00c1d4ad;
              }
              local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
              local_a8._M_value = 1.13635098543487e-322;
              local_3a8._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)&local_a8);
              local_3a8.field_2._M_allocated_capacity = (size_type)local_a8;
              builtin_strncpy(local_3a8._M_dataplus._M_p,"unexpected vector shape",0x17);
              local_3a8._M_string_length = (size_type)local_a8;
              local_3a8._M_dataplus._M_p[(long)local_a8] = '\0';
              Lexer::err((Err *)this,in,&local_3a8);
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48;
              puVar2 = (undefined1 *)
                       ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
              if ((undefined1 *)
                  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ == puVar2
                 ) {
                uStack_40 = CONCAT71(kind.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                     ._M_u._17_7_,
                                     kind.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                     ._M_u._16_1_);
              }
              else {
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                     _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                     _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_;
              }
              local_48 = (pointer)kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _M_u._8_8_;
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                   kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                   0xffffffffffffff00;
              local_38 = '\x01';
              uVar10 = local_3a8.field_2._M_allocated_capacity;
              _Var14._M_p = local_3a8._M_dataplus._M_p;
              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = puVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) goto LAB_00c1db1c;
            }
LAB_00c1dba2:
            std::
            vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
            ::~vector((vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                       *)auStack_2e8);
          }
          else {
            expected_04._M_str = "ref.extern";
            expected_04._M_len = 10;
            bVar5 = Lexer::takeSExprStart(in,expected_04);
            if (bVar5) {
              bVar5 = Lexer::takeRParen(in);
              if (bVar5) {
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index = '\b';
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
LAB_00c1de88:
                uStack_40 = CONCAT71(uStack_40._1_7_,1);
                local_38 = '\0';
              }
              else {
                local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
                local_a8._M_value = 1.28457067918724e-322;
                local_368._M_dataplus._M_p =
                     (pointer)std::__cxx11::string::_M_create((ulong *)&local_368,(ulong)&local_a8);
                local_368.field_2._M_allocated_capacity = (size_type)local_a8;
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 10) = 'n';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xb) = 'd';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xc) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xd) = 'o';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xe) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xf) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x10) = 'r';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x11) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x12) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x13) = '.';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x14) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x15) = 'x';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x16) = 't';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x17) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x18) = 'r';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x19) = 'n';
                *(undefined8 *)local_368._M_dataplus._M_p = 0x6465746365707865;
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 8) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 9) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 10) = 'n';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xb) = 'd';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xc) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xd) = 'o';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xe) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xf) = ' ';
                local_368._M_string_length = (size_type)local_a8;
                local_368._M_dataplus._M_p[(long)local_a8] = '\0';
                Lexer::err((Err *)this,in,&local_368);
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48
                ;
                puVar2 = (undefined1 *)
                         ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
                if ((undefined1 *)
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ ==
                    puVar2) {
                  uStack_40 = CONCAT71(kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._17_7_,
                                       kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._16_1_);
                }
                else {
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index;
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_;
                }
                local_48 = (pointer)kind.val.
                                    super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                    ._M_u._8_8_;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                     kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                     0xffffffffffffff00;
                local_38 = '\x01';
                uVar10 = local_368.field_2._M_allocated_capacity;
                _Var14._M_p = local_368._M_dataplus._M_p;
                _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = puVar2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != &local_368.field_2) goto LAB_00c1e11b;
              }
            }
            else {
              expected_06._M_str = "ref.func";
              expected_06._M_len = 8;
              bVar5 = Lexer::takeSExprStart(in,expected_06);
              if (bVar5) {
                bVar5 = Lexer::takeRParen(in);
                if (bVar5) {
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                       '\x10';
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
                  goto LAB_00c1de88;
                }
                local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
                local_a8._M_value = 1.18575755001899e-322;
                local_348._M_dataplus._M_p =
                     (pointer)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)&local_a8);
                local_348.field_2._M_allocated_capacity = (size_type)local_a8;
                *(undefined8 *)local_348._M_dataplus._M_p = 0x6465746365707865;
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 8) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 9) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 10) = 'n';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0xb) = 'd';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0xc) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0xd) = 'o';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0xe) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0xf) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x10) = 'r';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x11) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x12) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x13) = '.';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x14) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x15) = 'u';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x16) = 'n';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x17) = 'c';
                local_348._M_string_length = (size_type)local_a8;
                local_348._M_dataplus._M_p[(long)local_a8] = '\0';
                Lexer::err((Err *)this,in,&local_348);
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48
                ;
                puVar2 = (undefined1 *)
                         ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
                if ((undefined1 *)
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ ==
                    puVar2) {
                  uStack_40 = CONCAT71(kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._17_7_,
                                       kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._16_1_);
                }
                else {
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index;
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_;
                }
                local_48 = (pointer)kind.val.
                                    super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                    ._M_u._8_8_;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                     kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                     0xffffffffffffff00;
                local_38 = '\x01';
                uVar10 = local_348.field_2._M_allocated_capacity;
                _Var14._M_p = local_348._M_dataplus._M_p;
                _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = puVar2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p != &local_348.field_2) goto LAB_00c1e11b;
              }
              else {
                expected_07._M_str = "ref.struct";
                expected_07._M_len = 10;
                bVar5 = Lexer::takeSExprStart(in,expected_07);
                if (bVar5) {
                  bVar5 = Lexer::takeRParen(in);
                  if (bVar5) {
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index = '8'
                    ;
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
                    goto LAB_00c1de88;
                  }
                  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
                  local_a8._M_value = 1.28457067918724e-322;
                  local_328._M_dataplus._M_p =
                       (pointer)std::__cxx11::string::_M_create
                                          ((ulong *)&local_328,(ulong)&local_a8);
                  local_328.field_2._M_allocated_capacity = (size_type)local_a8;
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 10) = 'n';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xb) = 'd';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xc) = ' ';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xd) = 'o';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xe) = 'f';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xf) = ' ';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x10) = 'r';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x11) = 'e';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x12) = 'f';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x13) = '.';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x14) = 's';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x15) = 't';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x16) = 'r';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x17) = 'u';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x18) = 'c';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x19) = 't';
                  *(undefined8 *)local_328._M_dataplus._M_p = 0x6465746365707865;
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 8) = ' ';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 9) = 'e';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 10) = 'n';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xb) = 'd';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xc) = ' ';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xd) = 'o';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xe) = 'f';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xf) = ' ';
                  local_328._M_string_length = (size_type)local_a8;
                  local_328._M_dataplus._M_p[(long)local_a8] = '\0';
                  Lexer::err((Err *)this,in,&local_328);
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                       &local_48;
                  puVar2 = (undefined1 *)
                           ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                   .super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
                  if ((undefined1 *)
                      _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ ==
                      puVar2) {
                    uStack_40 = CONCAT71(kind.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         ._M_u._17_7_,
                                         kind.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         ._M_u._16_1_);
                  }
                  else {
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                         _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index;
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                         _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_;
                  }
                  local_48 = (pointer)kind.val.
                                      super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                      ._M_u._8_8_;
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                       kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_
                       & 0xffffffffffffff00;
                  local_38 = '\x01';
                  uVar10 = local_328.field_2._M_allocated_capacity;
                  _Var14._M_p = local_328._M_dataplus._M_p;
                  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = puVar2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_328._M_dataplus._M_p != &local_328.field_2) goto LAB_00c1e11b;
                }
                else {
                  expected_08._M_str = "ref.array";
                  expected_08._M_len = 9;
                  bVar5 = Lexer::takeSExprStart(in,expected_08);
                  if (bVar5) {
                    bVar5 = Lexer::takeRParen(in);
                    if (bVar5) {
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                           '@';
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
                      goto LAB_00c1de88;
                    }
                    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                    local_a8._M_value = (double)&DAT_00000019;
                    local_308._M_dataplus._M_p =
                         (pointer)std::__cxx11::string::_M_create
                                            ((ulong *)&local_308,(ulong)&local_a8);
                    local_308.field_2._M_allocated_capacity = (size_type)local_a8;
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 9) = 'e';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 10) = 'n';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xb) = 'd';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xc) = ' ';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xd) = 'o';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xe) = 'f';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xf) = ' ';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x10) = 'r';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x11) = 'e';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x12) = 'f';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x13) = '.';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x14) = 'a';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x15) = 'r';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x16) = 'r';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x17) = 'a';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x18) = 'y';
                    *(undefined8 *)local_308._M_dataplus._M_p = 0x6465746365707865;
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 8) = ' ';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 9) = 'e';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 10) = 'n';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xb) = 'd';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xc) = ' ';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xd) = 'o';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xe) = 'f';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xf) = ' ';
                    local_308._M_string_length = (size_type)local_a8;
                    local_308._M_dataplus._M_p[(long)local_a8] = '\0';
                    Lexer::err((Err *)this,in,&local_308);
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                         &local_48;
                    puVar2 = (undefined1 *)
                             ((long)&kind.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8
                             );
                    if ((undefined1 *)
                        _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ ==
                        puVar2) {
                      uStack_40 = CONCAT71(kind.val.
                                           super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           ._M_u._17_7_,
                                           kind.val.
                                           super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           ._M_u._16_1_);
                    }
                    else {
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                           _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           _M_index;
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                           _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_;
                    }
                    local_48 = (pointer)kind.val.
                                        super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .
                                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        ._M_u._8_8_;
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0
                    ;
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                         kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                         _8_8_ & 0xffffffffffffff00;
                    local_38 = '\x01';
                    uVar10 = local_308.field_2._M_allocated_capacity;
                    _Var14._M_p = local_308._M_dataplus._M_p;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                         puVar2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_308._M_dataplus._M_p != &local_308.field_2) goto LAB_00c1e11b;
                  }
                  else {
                    expected_09._M_str = "ref.eq";
                    expected_09._M_len = 6;
                    bVar5 = Lexer::takeSExprStart(in,expected_09);
                    if (bVar5) {
                      bVar5 = Lexer::takeRParen(in);
                      if (bVar5) {
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                             '(';
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0
                        ;
                        goto LAB_00c1de88;
                      }
                      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4c8,"expected end of ref.eq","");
                      Lexer::err((Err *)this,in,&local_4c8);
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                           &local_48;
                      puVar2 = (undefined1 *)
                               ((long)&kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                               8);
                      if ((undefined1 *)
                          _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_
                          == puVar2) {
                        uStack_40 = CONCAT71(kind.val.
                                             super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             ._M_u._17_7_,
                                             kind.val.
                                             super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             ._M_u._16_1_);
                      }
                      else {
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                             _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             _M_index;
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                             _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             _33_7_;
                      }
                      local_48 = (pointer)kind.val.
                                          super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          ._M_u._8_8_;
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ =
                           0;
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                           kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                           _8_8_ & 0xffffffffffffff00;
                      local_38 = '\x01';
                      uVar10 = local_4c8.field_2._M_allocated_capacity;
                      _Var14._M_p = local_4c8._M_dataplus._M_p;
                      _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                           puVar2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) goto LAB_00c1e11b;
                    }
                    else {
                      expected_10._M_str = "ref.i31";
                      expected_10._M_len = 7;
                      bVar5 = Lexer::takeSExprStart(in,expected_10);
                      if (bVar5) {
                        bVar5 = Lexer::takeRParen(in);
                        if (bVar5) {
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index
                               = '0';
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                               0;
                          goto LAB_00c1de88;
                        }
                        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_4a8,"expected end of ref.i31","");
                        Lexer::err((Err *)this,in,&local_4a8);
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                             &local_48;
                        puVar2 = (undefined1 *)
                                 ((long)&kind.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                 + 8);
                        if ((undefined1 *)
                            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_
                            == puVar2) {
                          uStack_40 = CONCAT71(kind.val.
                                               super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               ._M_u._17_7_,
                                               kind.val.
                                               super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               ._M_u._16_1_);
                        }
                        else {
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index
                               = _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                 .super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 _M_index;
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                               _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               _33_7_;
                        }
                        local_48 = (pointer)kind.val.
                                            super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            ._M_u._8_8_;
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_
                             = 0;
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_
                             = kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               _M_u._8_8_ & 0xffffffffffffff00;
                        local_38 = '\x01';
                        uVar10 = local_4a8.field_2._M_allocated_capacity;
                        _Var14._M_p = local_4a8._M_dataplus._M_p;
                        _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                             puVar2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) goto LAB_00c1e11b;
                      }
                      else {
                        expected_11._M_str = "ref.i31_shared";
                        expected_11._M_len = 0xe;
                        bVar5 = Lexer::takeSExprStart(in,expected_11);
                        if (bVar5) {
                          bVar5 = Lexer::takeRParen(in);
                          if (bVar5) {
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            _M_index = '4';
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_
                                 = 0;
                            goto LAB_00c1de88;
                          }
                          local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_488,"expected end of ref.i31_shared","");
                          Lexer::err((Err *)this,in,&local_488);
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                               &local_48;
                          if ((undefined1 *)
                              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              _32_8_ == (undefined1 *)
                                        ((long)&kind.val.
                                                super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                .
                                                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                .
                                                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                .
                                                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                .
                                                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        + 8U)) {
                            uStack_40 = CONCAT71(kind.val.
                                                 super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 ._M_u._17_7_,
                                                 kind.val.
                                                 super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 ._M_u._16_1_);
                          }
                          else {
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            _M_index = _val_1.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_index;
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_
                                 = _val_1.val.
                                   super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                   ._33_7_;
                          }
                          local_48 = (pointer)kind.val.
                                              super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              ._M_u._8_8_;
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _0_8_ = 0;
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _8_8_ = kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _M_u._8_8_ & 0xffffffffffffff00;
                          local_38 = '\x01';
                          uVar10 = local_488.field_2._M_allocated_capacity;
                          _Var14._M_p = local_488._M_dataplus._M_p;
                          _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                               (undefined1 *)
                               ((long)&kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                               8);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_488._M_dataplus._M_p != &local_488.field_2)
                          goto LAB_00c1e11b;
                        }
                        else {
                          local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_468,"unrecognized result","");
                          Lexer::err((Err *)this,in,&local_468);
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                               &local_48;
                          puVar2 = (undefined1 *)
                                   ((long)&kind.val.
                                           super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                   + 8);
                          if ((undefined1 *)
                              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              _32_8_ == puVar2) {
                            uStack_40 = CONCAT71(kind.val.
                                                 super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 ._M_u._17_7_,
                                                 kind.val.
                                                 super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 ._M_u._16_1_);
                          }
                          else {
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            _M_index = _val_1.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_index;
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_
                                 = _val_1.val.
                                   super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                   ._33_7_;
                          }
                          local_48 = (pointer)kind.val.
                                              super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              ._M_u._8_8_;
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _0_8_ = 0;
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _8_8_ = kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _M_u._8_8_ & 0xffffffffffffff00;
                          local_38 = '\x01';
                          uVar10 = local_468.field_2._M_allocated_capacity;
                          _Var14._M_p = local_468._M_dataplus._M_p;
                          _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                               puVar2;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_468._M_dataplus._M_p != &local_468.field_2) {
LAB_00c1e11b:
                            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_
                                 = (long)&kind.val.
                                          super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                   + 8;
                            local_38 = '\x01';
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                            _0_8_ = 0;
                            operator_delete(_Var14._M_p,(ulong)(uVar10 + 1));
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_00c1d8a4:
        std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::Err> *)local_238);
        if ((_val.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._M_first._M_storage._M_storage[0x38] == '\x01') &&
           (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x38] = '\0',
           (undefined1 *)
           _val.val.
           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           ._M_u._24_8_ !=
           (undefined1 *)
           ((long)&_val.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           + 0x28U))) {
          operator_delete((void *)_val.val.
                                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  ._M_u._24_8_,
                          CONCAT71(_val.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   ._M_u._41_7_,
                                   _val.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   ._M_u._M_first._M_storage._M_storage[0x28]) + 1);
        }
        if (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._0_8_ != 0) {
          operator_delete((void *)_val.val.
                                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  ._M_u._0_8_,
                          _val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._M_u._16_8_ -
                          _val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._M_u._0_8_);
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                           *)local_138,
                          (_Copy_ctor_base<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                           *)((long)&kind.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                             0x20));
        if (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
          puVar2 = (undefined1 *)
                   ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                           super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
          local_238 = (undefined1  [8])puVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_238,local_138,
                     (undefined1 *)
                     (_val.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._0_8_ + (long)local_138));
          local_448._0_8_ = local_448 + 0x10;
          if (local_238 == (undefined1  [8])puVar2) {
            local_448._24_8_ =
                 c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
          }
          else {
            local_448._0_8_ = local_238;
          }
          local_448._16_8_ =
               c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
          local_448._8_8_ =
               c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
          local_428 = '\x01';
          std::__detail::__variant::
          _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                               *)local_138);
          std::__detail::__variant::
          _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                               *)((long)&kind.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                 + 0x20));
          goto LAB_00c1e233;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                             *)local_138);
        this_00 = (_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                   *)((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20);
        __args = (_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                  *)0x0;
        if (local_38 == '\0') {
          __args = this_00;
        }
        std::
        vector<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>>
        ::
        emplace_back<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>
                  ((vector<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>>
                    *)auStack_418,
                   (variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>
                    *)__args);
        std::__detail::__variant::
        _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
        ::~_Variant_storage(this_00);
      }
      local_448._0_8_ = auStack_418;
      local_448._8_8_ =
           res.
           super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_448._16_8_ =
           res.
           super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      auStack_418 = (undefined1  [8])0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_428 = '\0';
LAB_00c1e233:
      std::
      vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ::~vector((vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                 *)auStack_418);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                         *)local_138,
                        (_Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                         *)local_448);
      if (_val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
        puVar2 = (undefined1 *)
                 ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
        local_238 = (undefined1  [8])puVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,local_138,
                   (undefined1 *)
                   (_val.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._0_8_ + (long)local_138));
        local_2c8 = (undefined1  [8])
                    ((long)&a_2.val.
                            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    + 8);
        if (local_238 == (undefined1  [8])puVar2) {
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
        }
        else {
          local_2c8 = local_238;
        }
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
        local_248 = '\x02';
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                             *)local_138);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                             *)local_138);
        bVar5 = Lexer::takeRParen(in);
        if (bVar5) {
          __rhs = (_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                   *)0x0;
          if (a.val.
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
            __rhs = (_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                     *)local_1c8;
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)local_138,__rhs);
          this_01 = (vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                     *)((long)&_val.val.
                               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       + 0x60);
          __x = (_Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                 *)0x0;
          if (local_428 == '\0') {
            __x = (_Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                   *)local_448;
          }
          std::
          vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
          ::vector(this_01,(vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                            *)__x);
          std::__detail::__variant::
          _Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
          _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)local_2c8,
                          (_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)local_138);
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._96_8_ = _val.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._96_8_;
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index = _val.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_index;
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._105_7_ = _val.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     ._105_7_;
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._96_8_ = 0;
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index = '\0';
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._105_7_ = 0;
          local_248 = '\0';
          std::
          vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
          ::~vector(this_01);
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             *)local_138);
        }
        else {
          local_238 = (undefined1  [8])0x1d;
          local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
          local_4f0._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_4f0,(ulong)local_238);
          local_4f0.field_2._M_allocated_capacity = (size_type)local_238;
          builtin_strncpy(local_4f0._M_dataplus._M_p,"expected end of assert_return",0x1d);
          local_4f0._M_string_length = (size_type)local_238;
          local_4f0._M_dataplus._M_p[(long)local_238] = '\0';
          Lexer::err((Err *)local_138,in,&local_4f0);
          local_2c8 = (undefined1  [8])
                      ((long)&a_2.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      + 8);
          puVar2 = (undefined1 *)
                   ((long)&_val.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   + 8);
          if (local_138 == (undefined1  [8])puVar2) {
            a_2.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._16_8_ = _val.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           ._M_u._16_8_;
          }
          else {
            local_2c8 = local_138;
          }
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._8_8_ = _val.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._8_8_;
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._0_8_ = _val.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._0_8_;
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._0_8_ = 0;
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._8_8_ = _val.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._8_8_ & 0xffffffffffffff00;
          local_248 = '\x02';
          local_138 = (undefined1  [8])puVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
            operator_delete(local_4f0._M_dataplus._M_p,
                            (ulong)(local_4f0.field_2._M_allocated_capacity + 1));
          }
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                           *)local_448);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         *)local_1c8);
    if (local_248 != '\x01') {
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
                 local_138,
                 (_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
                 local_2c8);
      if (local_b8 == '\x02') {
        puVar2 = (undefined1 *)
                 ((long)&a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8);
        local_1c8 = (undefined1  [8])puVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c8,local_138,
                   (undefined1 *)
                   (_val.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._0_8_ + (long)local_138));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             = puVar1;
        if (local_1c8 == (undefined1  [8])puVar2) {
          *puVar1 = CONCAT71(a.val.
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             ._M_u._9_7_,
                             a.val.
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             ._M_u._M_first._M_storage._M_storage[8]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
           + 0x18) = a.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     ._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               = local_1c8;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            .
                            super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                    + 0x10) =
               CONCAT71(a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._9_7_,
                        a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._M_first._M_storage._M_storage[8]);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
         + 8) = a.val.
                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                ._M_u._0_8_;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
         + 0x88) = '\x02';
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                           *)local_138);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                           *)local_138);
        p_Var11 = (_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
                  0x0;
        if (local_248 == '\0') {
          p_Var11 = (_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
                    local_2c8;
        }
        std::__detail::__variant::_Uninitialized<wasm::WATParser::AssertReturn,false>::
        _Uninitialized<wasm::WATParser::AssertReturn&>
                  ((_Uninitialized<wasm::WATParser::AssertReturn,false> *)local_138,p_Var11);
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)__return_storage_ptr__,
                          (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)local_138);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
         + 0x88) = '\0';
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                             *)local_138);
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                         *)local_2c8);
      return extraout_RAX;
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
             local_2c8);
  expected_12._M_str = "assert_exception";
  expected_12._M_len = 0x10;
  bVar5 = Lexer::takeSExprStart(in,expected_12);
  if (bVar5) {
    action((Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
           local_2c8,in);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_1c8,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_2c8);
    if (a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x01') {
      puVar2 = (undefined1 *)
               ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      local_238 = (undefined1  [8])puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_1c8,
                 (undefined1 *)
                 (a.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_ + (long)local_1c8));
      local_138 = (undefined1  [8])
                  ((long)&_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  + 8);
      if (local_238 == (undefined1  [8])puVar2) {
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
      }
      else {
        local_138 = local_238;
      }
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_index = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1c8);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1c8);
      bVar5 = Lexer::takeRParen(in);
      if (bVar5) {
        local_1c8._0_4_ = 2;
        p_Var12 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   *)0x0;
        if (a_2.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
          p_Var12 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     *)local_2c8;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&a,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                               *)p_Var12);
        local_138._0_4_ = local_1c8._0_4_;
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&_val,(_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                                  *)&a);
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = _val.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._104_8_ & 0xffffffffffffff00;
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&a);
      }
      else {
        puVar2 = (undefined1 *)
                 ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
        local_238 = (undefined1  [8])0x20;
        _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = puVar2;
        _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
             std::__cxx11::string::_M_create
                       ((ulong *)((long)&_val_1.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                 + 0x20),(ulong)local_238);
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ = local_238;
        builtin_strncpy((char *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                _32_8_,"expected end of assert_exception",0x20);
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = local_238;
        *(char *)(_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ +
                 (long)local_238) = '\0';
        Lexer::err((Err *)local_1c8,in,
                   (string *)
                   ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
        local_138 = (undefined1  [8])
                    ((long)&_val.val.
                            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    + 8);
        puVar3 = (undefined1 *)
                 ((long)&a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8);
        if (local_1c8 == (undefined1  [8])puVar3) {
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._16_8_ = a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._16_8_;
        }
        else {
          local_138 = local_1c8;
        }
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._9_7_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._M_first._M_storage._M_storage[8];
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._0_8_;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = 0;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] = '\0';
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index = '\x02';
        local_1c8 = (undefined1  [8])puVar3;
        if ((undefined1 *)
            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ != puVar2) {
          operator_delete((void *)_val_1.val.
                                  super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _32_8_,
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _8_8_ + 1);
        }
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         *)local_2c8);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index == '\x01') goto LAB_00c1e7ec;
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               local_2c8,
               (_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               local_138);
    if (a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index != '\x02') {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         *)local_2c8);
      local_2c8._0_4_ = local_138._0_4_;
      pRVar13 = (Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
                &DAT_00000008;
      if (_val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index == '\0') {
        pRVar13 = &_val;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       *)&a_2,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                               *)pRVar13);
      std::__detail::__variant::
      _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)__return_storage_ptr__,
                        (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)local_2c8);
LAB_00c1eeb4:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
       + 0x88) = '\0';
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)local_2c8);
      goto LAB_00c1ef1b;
    }
    local_1c8 = (undefined1  [8])
                ((long)&a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,local_2c8,
               (undefined1 *)
               (a_2.val.
                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                ._M_u._0_8_ + (long)local_2c8));
LAB_00c1ed7f:
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
         = puVar1;
    if (local_1c8 ==
        (undefined1  [8])
        ((long)&a.val.
                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        + 8U)) {
      *puVar1 = CONCAT71(a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._9_7_,
                         a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._M_first._M_storage._M_storage[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
       + 0x18) = a.val.
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 ._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).
        super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
           = local_1c8;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                + 0x10) =
           CONCAT71(a.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._9_7_,
                    a.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._M_first._M_storage._M_storage[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
     + 8) = a.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
     + 0x88) = '\x02';
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               local_2c8);
LAB_00c1ef1b:
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               local_138);
    return extraout_RAX_00;
  }
  _val.val.
  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  .
  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  .
  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  .
  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  .
  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  .
  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  ._M_index = '\x01';
LAB_00c1e7ec:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
             local_138);
  expected_13._M_str = "assert_exhaustion";
  expected_13._M_len = 0x11;
  bVar5 = Lexer::takeSExprStart(in,expected_13);
  if (bVar5) {
    action((Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
           local_2c8,in);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_1c8,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_2c8);
    if (a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x01') {
      puVar2 = (undefined1 *)
               ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      local_238 = (undefined1  [8])puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_1c8,
                 (undefined1 *)
                 (a.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_ + (long)local_1c8));
      local_138 = (undefined1  [8])
                  ((long)&_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  + 8);
      if (local_238 == (undefined1  [8])puVar2) {
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
      }
      else {
        local_138 = local_238;
      }
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_index = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1c8);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1c8);
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_238,in);
      if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
        puVar2 = (undefined1 *)
                 ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index = '\x16';
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
        _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = puVar2;
        _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
             std::__cxx11::string::_M_create
                       ((ulong *)((long)&_val_1.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                 + 0x20),
                        (ulong)((long)&kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                               0x20));
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
             kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
        builtin_strncpy((char *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                _32_8_,"expected error message",0x16);
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ =
             kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
        *(char *)(_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ +
                 kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_) = '\0';
        Lexer::err((Err *)local_1c8,in,
                   (string *)
                   ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
        local_138 = (undefined1  [8])
                    ((long)&_val.val.
                            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    + 8);
        puVar3 = (undefined1 *)
                 ((long)&a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8);
        if (local_1c8 == (undefined1  [8])puVar3) {
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._16_8_ = a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._16_8_;
        }
        else {
          local_138 = local_1c8;
        }
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._9_7_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._M_first._M_storage._M_storage[8];
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._0_8_;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = 0;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] = '\0';
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index = '\x02';
        uVar10 = kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_;
        _Var15 = (_Storage<double,_true>)
                 _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
        local_1c8 = (undefined1  [8])puVar3;
        if ((undefined1 *)
            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ != puVar2) {
LAB_00c1eb8a:
          local_1c8 = (undefined1  [8])
                      ((long)&a.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      + 8);
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[8] = '\0';
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._0_8_ = 0;
          operator_delete((void *)_Var15,uVar10 + 1);
        }
      }
      else {
        bVar5 = Lexer::takeRParen(in);
        if (bVar5) {
          local_1c8._0_4_ = 1;
          p_Var12 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     *)0x0;
          if (a_2.val.
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
            p_Var12 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_2c8;
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&a,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                                 *)p_Var12);
          local_138._0_4_ = local_1c8._0_4_;
          std::__detail::__variant::
          _Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
          _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&_val,(_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                                    *)&a);
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._104_8_ = _val.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     ._104_8_ & 0xffffffffffffff00;
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             *)&a);
        }
        else {
          _Var4 = (_Storage<double,_true>)
                  ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
          local_a8 = _Var4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"expected end of assertion","");
          Lexer::err((Err *)local_1c8,in,(string *)&local_a8);
          local_138 = (undefined1  [8])
                      ((long)&_val.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      + 8);
          puVar2 = (undefined1 *)
                   ((long)&a.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   + 8);
          if (local_1c8 == (undefined1  [8])puVar2) {
            _val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._16_8_ = a.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           ._M_u._16_8_;
          }
          else {
            local_138 = local_1c8;
          }
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._9_7_ = a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._9_7_;
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[8] =
               a.val.
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               ._M_u._M_first._M_storage._M_storage[8];
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._0_8_ = a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._0_8_;
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._0_8_ = 0;
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[8] = '\0';
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index = '\x02';
          uVar10 = _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_;
          _Var15 = local_a8;
          local_1c8 = (undefined1  [8])puVar2;
          if (local_a8 != _Var4) goto LAB_00c1eb8a;
        }
      }
      if ((c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
           super__Move_assign_alias<wasm::Literal,_wasm::Err>.
           super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
           super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
           super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\x01') &&
         (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ = 0,
         local_238 !=
         (undefined1  [8])
         ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8U))) {
        operator_delete((void *)local_238,
                        c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         *)local_2c8);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index != '\x01') {
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
                 local_2c8,
                 (_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
                 local_138);
      if (a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index != '\x02') {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                           *)local_2c8);
        local_2c8._0_4_ = local_138._0_4_;
        pRVar13 = (Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                   *)&DAT_00000008;
        if (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_index == '\0') {
          pRVar13 = &_val;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&a_2,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                                 *)pRVar13);
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)__return_storage_ptr__,
                          (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)local_2c8);
        goto LAB_00c1eeb4;
      }
      local_1c8 = (undefined1  [8])
                  ((long)&a.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,local_2c8,
                 (undefined1 *)
                 (a_2.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_ + (long)local_2c8));
      goto LAB_00c1ed7f;
    }
  }
  else {
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_index = '\x01';
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
             local_138);
  expected_14._M_str = "assert_malformed";
  expected_14._M_len = 0x10;
  bVar5 = Lexer::takeSExprStart(in,expected_14);
  if (bVar5) {
    uVar17 = 1;
LAB_00c1ec01:
    bVar5 = false;
LAB_00c1ec29:
    wastModule((Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>
                *)local_2c8,in,bVar5);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       *)local_1c8,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       *)local_2c8);
    if (a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x28] == '\x01') {
      puVar2 = (undefined1 *)
               ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      local_238 = (undefined1  [8])puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_1c8,
                 (undefined1 *)
                 (a.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_ + (long)local_1c8));
      local_138 = (undefined1  [8])
                  ((long)&_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  + 8);
      if (local_238 == (undefined1  [8])puVar2) {
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
      }
      else {
        local_138 = local_238;
      }
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x30] = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                           *)local_1c8);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                           *)local_1c8);
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_238,in);
      if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
        puVar2 = (undefined1 *)
                 ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index = '\x16';
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
        _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = puVar2;
        _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
             std::__cxx11::string::_M_create
                       ((ulong *)((long)&_val_1.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                 + 0x20),
                        (ulong)((long)&kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                               0x20));
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
             kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
        builtin_strncpy((char *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                _32_8_,"expected error message",0x16);
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ =
             kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
        *(char *)(_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ +
                 kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_) = '\0';
        Lexer::err((Err *)local_1c8,in,
                   (string *)
                   ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
        local_138 = (undefined1  [8])
                    ((long)&_val.val.
                            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    + 8);
        puVar3 = (undefined1 *)
                 ((long)&a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8);
        if (local_1c8 == (undefined1  [8])puVar3) {
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._16_8_ = a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._16_8_;
        }
        else {
          local_138 = local_1c8;
        }
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._9_7_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._M_first._M_storage._M_storage[8];
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._0_8_;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = 0;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] = '\0';
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x30] = '\x02';
        uVar10 = kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_;
        _Var15 = (_Storage<double,_true>)
                 _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
        local_1c8 = (undefined1  [8])puVar3;
        if ((undefined1 *)
            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ != puVar2) {
LAB_00c1f02f:
          local_1c8 = (undefined1  [8])
                      ((long)&a.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      + 8);
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x30] = '\x02';
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[8] = '\0';
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._0_8_ = 0;
          operator_delete((void *)_Var15,uVar10 + 1);
        }
      }
      else {
        bVar5 = Lexer::takeRParen(in);
        if (bVar5) {
          local_1c8._0_4_ = uVar17;
          __rhs_00 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                      *)0x0;
          if (a_2.val.
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              ._M_u._M_first._M_storage._M_storage[0x28] == '\0') {
            __rhs_00 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        *)local_2c8;
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                           *)&a,(_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                 *)__rhs_00);
          local_138._0_4_ = local_1c8._0_4_;
          std::__detail::__variant::
          _Move_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
          _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                           *)&_val,(_Move_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    *)&a);
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x30] = '\0';
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             *)&a);
        }
        else {
          _Var4 = (_Storage<double,_true>)
                  ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
          local_a8 = _Var4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"expected end of assertion","");
          Lexer::err((Err *)local_1c8,in,(string *)&local_a8);
          local_138 = (undefined1  [8])
                      ((long)&_val.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      + 8);
          puVar2 = (undefined1 *)
                   ((long)&a.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   + 8);
          if (local_1c8 == (undefined1  [8])puVar2) {
            _val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._16_8_ = a.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           ._M_u._16_8_;
          }
          else {
            local_138 = local_1c8;
          }
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._9_7_ = a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._9_7_;
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[8] =
               a.val.
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               ._M_u._M_first._M_storage._M_storage[8];
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._0_8_ = a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._0_8_;
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._0_8_ = 0;
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[8] = '\0';
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x30] = '\x02';
          uVar10 = _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_;
          _Var15 = local_a8;
          local_1c8 = (undefined1  [8])puVar2;
          if (local_a8 != _Var4) goto LAB_00c1f02f;
        }
      }
      if ((c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
           super__Move_assign_alias<wasm::Literal,_wasm::Err>.
           super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
           super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
           super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\x01') &&
         (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ = 0,
         local_238 !=
         (undefined1  [8])
         ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8U))) {
        operator_delete((void *)local_238,
                        c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                         *)local_2c8);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x30] != '\x01') {
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
                 local_2c8,
                 (_Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
                 local_138);
      if (a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x30] == '\x02') {
        puVar2 = (undefined1 *)
                 ((long)&a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8);
        local_1c8 = (undefined1  [8])puVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c8,local_2c8,
                   (undefined1 *)
                   (a_2.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._0_8_ + (long)local_2c8));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             = puVar1;
        if (local_1c8 == (undefined1  [8])puVar2) {
          *puVar1 = CONCAT71(a.val.
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             ._M_u._9_7_,
                             a.val.
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             ._M_u._M_first._M_storage._M_storage[8]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
           + 0x18) = a.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     ._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               = local_1c8;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            .
                            super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                    + 0x10) =
               CONCAT71(a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._9_7_,
                        a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._M_first._M_storage._M_storage[8]);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
         + 8) = a.val.
                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                .
                super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                ._M_u._0_8_;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
         + 0x88) = '\x02';
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                           *)local_2c8);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                           *)local_2c8);
        local_2c8._0_4_ = local_138._0_4_;
        pRVar13 = (Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                   *)&DAT_00000008;
        if (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x30] == '\0') {
          pRVar13 = &_val;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                         *)&a_2,(_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                 *)pRVar13);
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)__return_storage_ptr__,
                          (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)local_2c8);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
         + 0x88) = '\0';
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                             *)local_2c8);
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                         *)local_138);
      return extraout_RAX_01;
    }
  }
  else {
    expected_15._M_str = "assert_invalid";
    expected_15._M_len = 0xe;
    bVar5 = Lexer::takeSExprStart(in,expected_15);
    if (bVar5) {
      uVar17 = 2;
      bVar5 = true;
      goto LAB_00c1ec29;
    }
    expected_16._M_str = "assert_unlinkable";
    expected_16._M_len = 0x11;
    bVar5 = Lexer::takeSExprStart(in,expected_16);
    if (bVar5) {
      uVar17 = 3;
      goto LAB_00c1ec01;
    }
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._M_first._M_storage._M_storage[0x30] = '\x01';
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
             local_138);
  expected_17._M_str = "assert_trap";
  expected_17._M_len = 0xb;
  bVar5 = Lexer::takeSExprStart(in,expected_17);
  if (!bVar5) {
    local_240 = '\x01';
    goto LAB_00c1f72a;
  }
  pos = in->pos;
  maybeAction((MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
               *)local_1c8,in);
  if (a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x60] != '\x01') {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)local_138,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)local_1c8);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x02') {
      puVar2 = (undefined1 *)
               ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      local_238 = (undefined1  [8])puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_138,
                 (undefined1 *)
                 (_val.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_ + (long)local_138));
      local_2c8 = (undefined1  [8])
                  ((long)&a_2.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  + 8);
      if (local_238 == (undefined1  [8])puVar2) {
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
      }
      else {
        local_2c8 = local_238;
      }
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
      local_240 = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           *)local_138);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           *)local_138);
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20),in);
      if (kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ == '\0') {
        local_238 = (undefined1  [8])
                    ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"expected error message","");
        Lexer::err((Err *)local_138,in,(string *)local_238);
LAB_00c1f67a:
        local_2c8 = (undefined1  [8])
                    ((long)&a_2.val.
                            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    + 8);
        puVar2 = (undefined1 *)
                 ((long)&_val.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8);
        if (local_138 == (undefined1  [8])puVar2) {
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._16_8_ = _val.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._16_8_;
        }
        else {
          local_2c8 = local_138;
        }
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._8_8_ = _val.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._8_8_;
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = _val.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._0_8_;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = 0;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._8_8_ = _val.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._8_8_ & 0xffffffffffffff00;
        local_240 = '\x02';
        local_138 = (undefined1  [8])puVar2;
        if (local_238 !=
            (undefined1  [8])
            ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8U)) {
          operator_delete((void *)local_238,
                          c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
        }
      }
      else {
        bVar5 = Lexer::takeRParen(in);
        if (!bVar5) {
          local_238 = (undefined1  [8])
                      ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"expected end of assertion","");
          Lexer::err((Err *)local_138,in,(string *)local_238);
          goto LAB_00c1f67a;
        }
        local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
        __rhs_02 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    *)0x0;
        if (a.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
          __rhs_02 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                      *)local_1c8;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&c,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                               *)__rhs_02);
        local_138._0_4_ = local_238._0_4_;
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&_val,(_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                                  *)&c);
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)local_2c8,
                          (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)local_138);
        local_240 = '\0';
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                             *)local_138);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&c);
      }
      if ((kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ == '\x01')
         && (kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ = 0,
            (undefined1 *)
            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ !=
            (undefined1 *)
            ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8U))) {
        operator_delete((void *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                _32_8_,
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_
                        + 1);
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         *)local_1c8);
    goto LAB_00c1f72a;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)local_1c8);
  wastModule((Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_> *
             )local_1c8,in,false);
  if (a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x28] == '\x01') {
    puVar2 = (undefined1 *)
             ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                     super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
    local_238 = (undefined1  [8])puVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"expected action or module","");
    Lexer::err((Err *)local_138,in,pos,(string *)local_238);
    local_2c8 = (undefined1  [8])
                ((long)&a_2.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                + 8);
    puVar3 = (undefined1 *)
             ((long)&_val.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             + 8);
    if (local_138 == (undefined1  [8])puVar3) {
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._16_8_ = _val.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     ._M_u._16_8_;
    }
    else {
      local_2c8 = local_138;
    }
    a_2.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._8_8_ = _val.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._8_8_;
    a_2.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._0_8_ = _val.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_;
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._0_8_ = 0;
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._8_8_ = _val.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._8_8_ & 0xffffffffffffff00;
    local_240 = '\x02';
    auVar16 = local_238;
    local_138 = (undefined1  [8])puVar3;
    if (local_238 != (undefined1  [8])puVar2) {
LAB_00c1f626:
      operator_delete((void *)auVar16,
                      c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
    }
  }
  else {
    Lexer::takeString_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20),in);
    if (kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ == '\0') {
      local_238 = (undefined1  [8])
                  ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_238,"expected error message","");
      Lexer::err((Err *)local_138,in,(string *)local_238);
LAB_00c1f58a:
      local_2c8 = (undefined1  [8])
                  ((long)&a_2.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  + 8);
      puVar2 = (undefined1 *)
               ((long)&_val.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 8);
      if (local_138 == (undefined1  [8])puVar2) {
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = _val.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       ._M_u._16_8_;
      }
      else {
        local_2c8 = local_138;
      }
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = _val.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._8_8_;
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = _val.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._0_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = 0;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = _val.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._8_8_ & 0xffffffffffffff00;
      local_240 = '\x02';
      local_138 = (undefined1  [8])puVar2;
      if (local_238 !=
          (undefined1  [8])
          ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                  super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8U)) {
        operator_delete((void *)local_238,
                        c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
      }
    }
    else {
      bVar5 = Lexer::takeRParen(in);
      if (!bVar5) {
        local_238 = (undefined1  [8])
                    ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"expected end of assertion","");
        Lexer::err((Err *)local_138,in,(string *)local_238);
        goto LAB_00c1f58a;
      }
      local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
      __rhs_01 = (MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                  *)0x0;
      if (a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x28] == '\0') {
        __rhs_01 = (MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                    *)local_1c8;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       *)&c,(_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             *)__rhs_01);
      local_a8 = (_Storage<double,_true>)&_val;
      local_138._0_4_ = local_238._0_4_;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_&&>
        ::_S_vtable._M_arr[(long)(char)local_208 + 1]._M_data)
                ((anon_class_8_1_a78179b7_conflict72 *)&local_a8,
                 (variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_> *)&c);
      std::__detail::__variant::
      _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)local_2c8,
                        (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)local_138);
      local_240 = '\0';
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)local_138);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                         *)&c);
    }
    if ((kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ == '\x01') &&
       (kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ = 0,
       c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ =
            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_,
       auVar16 = (undefined1  [8])
                 _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_,
       (undefined1 *)
       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ !=
       (undefined1 *)
       ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8U)))
    goto LAB_00c1f626;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       *)local_1c8);
LAB_00c1f72a:
  if (local_240 == '\x01') {
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         *)local_2c8);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
     + 0x88) = '\x01';
    pMVar7 = extraout_RAX_02;
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       *)local_138,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       *)local_2c8);
    if (local_b0 == '\x02') {
      puVar2 = (undefined1 *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 8);
      local_1c8 = (undefined1  [8])puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,local_138,
                 (undefined1 *)
                 (_val.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_ + (long)local_138));
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
           = puVar1;
      if (local_1c8 == (undefined1  [8])puVar2) {
        *puVar1 = CONCAT71(a.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           ._M_u._9_7_,
                           a.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
         + 0x18) = a.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).
          super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             = local_1c8;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                  + 0x10) =
             CONCAT71(a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_,
                      a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
       + 8) = a.val.
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              ._M_u._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
       + 0x88) = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                           *)local_138);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                           *)local_138);
      __rhs_03 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                  *)0x0;
      if (local_240 == '\0') {
        __rhs_03 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                    *)local_2c8;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)__return_storage_ptr__,
                        (_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)__rhs_03);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
       + 0x88) = '\0';
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         *)local_2c8);
    pMVar7 = extraout_RAX_03;
  }
  return pMVar7;
}

Assistant:

MaybeResult<Assertion> assertion(Lexer& in) {
  if (auto a = assertReturn(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertException(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertAction(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertModule(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertTrap(in)) {
    CHECK_ERR(a);
    return *a;
  }
  return {};
}